

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void geopolyCcwFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  undefined4 uVar1;
  sqlite3_context *pCtx;
  int *in_RDI;
  double dVar2;
  sqlite3_value *unaff_retaddr;
  sqlite3_context *in_stack_00000008;
  GeoCoord t;
  int jj;
  int ii;
  GeoPoly *p;
  _func_void_void_ptr *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  pCtx = (sqlite3_context *)geopolyFuncParam(in_stack_00000008,unaff_retaddr,in_RDI);
  if (pCtx != (sqlite3_context *)0x0) {
    dVar2 = geopolyArea((GeoPoly *)pCtx);
    if (dVar2 < 0.0) {
      in_stack_ffffffffffffffd8 = *(int *)&pCtx->pOut;
      for (in_stack_ffffffffffffffdc = 1; in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 + -1
          , in_stack_ffffffffffffffdc < in_stack_ffffffffffffffd8;
          in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 1) {
        uVar1 = *(undefined4 *)
                 ((long)pCtx->argv + (long)(in_stack_ffffffffffffffdc << 1) * 4 + -0x28);
        *(undefined4 *)((long)pCtx->argv + (long)(in_stack_ffffffffffffffdc << 1) * 4 + -0x28) =
             *(undefined4 *)((long)pCtx->argv + (long)(in_stack_ffffffffffffffd8 * 2) * 4 + -0x28);
        *(undefined4 *)((long)pCtx->argv + (long)(in_stack_ffffffffffffffd8 * 2) * 4 + -0x28) =
             uVar1;
        in_stack_ffffffffffffffd4 =
             *(int *)((long)pCtx->argv + (long)(in_stack_ffffffffffffffdc * 2 + 1) * 4 + -0x28);
        *(undefined4 *)((long)pCtx->argv + (long)(in_stack_ffffffffffffffdc * 2 + 1) * 4 + -0x28) =
             *(undefined4 *)
              ((long)pCtx->argv + (long)(in_stack_ffffffffffffffd8 * 2 + 1) * 4 + -0x28);
        *(int *)((long)pCtx->argv + (long)(in_stack_ffffffffffffffd8 * 2 + 1) * 4 + -0x28) =
             in_stack_ffffffffffffffd4;
      }
    }
    sqlite3_result_blob(pCtx,(void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
    sqlite3_free((void *)0x2a094d);
  }
  return;
}

Assistant:

static void geopolyCcwFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  GeoPoly *p = geopolyFuncParam(context, argv[0], 0);
  (void)argc;
  if( p ){
    if( geopolyArea(p)<0.0 ){
      int ii, jj;
      for(ii=1, jj=p->nVertex-1; ii<jj; ii++, jj--){
        GeoCoord t = GeoX(p,ii);
        GeoX(p,ii) = GeoX(p,jj);
        GeoX(p,jj) = t;
        t = GeoY(p,ii);
        GeoY(p,ii) = GeoY(p,jj);
        GeoY(p,jj) = t;
      }
    }
    sqlite3_result_blob(context, p->hdr,
       4+8*p->nVertex, SQLITE_TRANSIENT);
    sqlite3_free(p);
  }
}